

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

string_type * __thiscall
toml::detail::serializer<toml::type_config>::format_indent_abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,
          indent_char indent_type)

{
  uint uVar1;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  size_type __n;
  long lVar2;
  _Alloc_hider _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT71(in_register_00000011,indent_type);
  uVar1 = this->current_indent_;
  __n = 0;
  if (0 < (int)uVar1) {
    __n = (size_type)uVar1;
  }
  if ((int)s == 1) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    if ((int)uVar1 < 1) {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_50,__n,'\t');
      s = extraout_RDX_00;
    }
    string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
              (__return_storage_ptr__,(detail *)&local_50,s);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return __return_storage_ptr__;
    }
    lVar2 = CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,local_50.field_2._M_local_buf[0]);
    _Var3._M_p = local_50._M_dataplus._M_p;
  }
  else {
    if ((int)s != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    if ((int)uVar1 < 1) {
      local_30._M_string_length = 0;
      local_30.field_2._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_30,__n,' ');
      s = extraout_RDX;
    }
    string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
              (__return_storage_ptr__,(detail *)&local_30,s);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == &local_30.field_2) {
      return __return_storage_ptr__;
    }
    lVar2 = CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,local_30.field_2._M_local_buf[0]);
    _Var3._M_p = local_30._M_dataplus._M_p;
  }
  operator_delete(_Var3._M_p,lVar2 + 1);
  return __return_storage_ptr__;
}

Assistant:

string_type format_indent(const indent_char indent_type) const // {{{
    {
        const auto indent = static_cast<std::size_t>((std::max)(0, this->current_indent_));
        if(indent_type == indent_char::space)
        {
            return string_conv<string_type>(make_string(indent, ' '));
        }
        else if(indent_type == indent_char::tab)
        {
            return string_conv<string_type>(make_string(indent, '\t'));
        }
        else
        {
            return string_type{};
        }
    }